

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O0

void group_destroy(group_t *g)

{
  group_t *g_local;
  
  g->size = 0;
  free(g->lid);
  free(g->rof);
  free(g->gid);
  g->lid = (bsp_pid_t *)0x0;
  g->rof = (bsp_size_t *)0x0;
  g->gid = (bsp_pid_t *)0x0;
  return;
}

Assistant:

static void group_destroy( group_t * g )
{
    g->size = 0;
    free(g->lid);
    free(g->rof);
    free(g->gid);
    g->lid = NULL;
    g->rof = NULL;
    g->gid = NULL;
}